

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError IsFormatSupported(PaUtilHostApiRepresentation *hostApi,PaStreamParameters *inputParameters,
                         PaStreamParameters *outputParameters,double sampleRate)

{
  PaError PVar1;
  char *format;
  bool bVar2;
  bool bVar3;
  
  if (inputParameters == (PaStreamParameters *)0x0) {
    bVar2 = true;
    if (outputParameters != (PaStreamParameters *)0x0) {
LAB_0010c576:
      paUtilErr_ = ValidateParameters(outputParameters,hostApi,StreamDirection_Out);
      if (paUtilErr_ < 0) {
        format = 
        "Expression \'ValidateParameters( outputParameters, hostApi, StreamDirection_Out )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1845\n"
        ;
        goto LAB_0010c607;
      }
      bVar3 = outputParameters->channelCount == 0;
      if (!bVar2) goto LAB_0010c5aa;
      if (outputParameters->channelCount != 0) goto LAB_0010c5dd;
    }
LAB_0010c5a6:
    PVar1 = 0;
  }
  else {
    paUtilErr_ = ValidateParameters(inputParameters,hostApi,StreamDirection_In);
    if (-1 < paUtilErr_) {
      bVar2 = inputParameters->channelCount == 0;
      if (outputParameters != (PaStreamParameters *)0x0) goto LAB_0010c576;
      bVar3 = true;
      if (inputParameters->channelCount == 0) goto LAB_0010c5a6;
LAB_0010c5aa:
      PVar1 = TestParameters(hostApi,inputParameters,sampleRate,StreamDirection_In);
      if ((bool)(PVar1 != 0 | bVar3)) {
        return PVar1;
      }
LAB_0010c5dd:
      PVar1 = TestParameters(hostApi,outputParameters,sampleRate,StreamDirection_Out);
      return PVar1;
    }
    format = 
    "Expression \'ValidateParameters( inputParameters, hostApi, StreamDirection_In )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1837\n"
    ;
LAB_0010c607:
    PaUtil_DebugPrint(format);
    PVar1 = paUtilErr_;
  }
  return PVar1;
}

Assistant:

static PaError IsFormatSupported( struct PaUtilHostApiRepresentation *hostApi,
                                  const PaStreamParameters *inputParameters,
                                  const PaStreamParameters *outputParameters,
                                  double sampleRate )
{
    int inputChannelCount = 0, outputChannelCount = 0;
    PaSampleFormat inputSampleFormat, outputSampleFormat;
    PaError result = paFormatIsSupported;

    if( inputParameters )
    {
        PA_ENSURE( ValidateParameters( inputParameters, hostApi, StreamDirection_In ) );

        inputChannelCount = inputParameters->channelCount;
        inputSampleFormat = inputParameters->sampleFormat;
    }

    if( outputParameters )
    {
        PA_ENSURE( ValidateParameters( outputParameters, hostApi, StreamDirection_Out ) );

        outputChannelCount = outputParameters->channelCount;
        outputSampleFormat = outputParameters->sampleFormat;
    }

    if( inputChannelCount )
    {
        if( ( result = TestParameters( hostApi, inputParameters, sampleRate, StreamDirection_In ) )
                != paNoError )
            goto error;
    }
    if ( outputChannelCount )
    {
        if( ( result = TestParameters( hostApi, outputParameters, sampleRate, StreamDirection_Out ) )
                != paNoError )
            goto error;
    }

    return paFormatIsSupported;

error:
    return result;
}